

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O3

float rsg::
      UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::AcosOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::AcosOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::AcosOp>_>
      ::getWeight(GeneratorState *state,ConstValueRangeAccess valueRange)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  fVar6 = 0.0;
  if ((valueRange.m_type)->m_baseType == TYPE_FLOAT) {
    iVar2 = state->m_shaderParams->maxExpressionDepth;
    iVar3 = state->m_expressionDepth;
    iVar4 = getConservativeValueExprDepth(state,valueRange);
    fVar6 = 0.0;
    if (iVar4 + 1 <= iVar2 - iVar3) {
      if ((valueRange.m_type)->m_numElements < 1) {
        fVar6 = 1.0;
      }
      else {
        fVar6 = 1.0;
        lVar5 = 0;
        do {
          VariableType::getElementType(valueRange.m_type);
          fVar10 = valueRange.m_min[lVar5].floatVal;
          VariableType::getElementType(valueRange.m_type);
          fVar8 = 1.0;
          if (-INFINITY < fVar10) {
            fVar1 = valueRange.m_max[lVar5].floatVal;
            fVar8 = 1.0;
            if (((fVar1 < INFINITY) && (fVar8 = 0.0, fVar10 <= 3.1415927)) && (0.0 <= fVar1)) {
              fVar7 = cosf((float)(-(uint)(0.0 <= fVar10) & (uint)fVar10));
              fVar8 = fVar1;
              if (3.1415927 <= fVar1) {
                fVar8 = 3.1415927;
              }
              fVar8 = cosf(fVar8);
              fVar9 = ceilf(fVar8 * 8.0);
              fVar9 = fVar9 * 0.125;
              if (fVar9 <= fVar7) {
                fVar7 = floorf(fVar7 * 8.0);
                fVar8 = 0.0;
                if (fVar9 <= fVar7 * 0.125) {
                  if ((fVar10 != fVar1) || (fVar8 = 1.0, NAN(fVar10) || NAN(fVar1))) {
                    fVar8 = acosf(fVar7 * 0.125);
                    fVar7 = acosf(fVar9);
                    fVar10 = (fVar8 - fVar7) / (fVar1 - fVar10);
                    fVar8 = 0.1;
                    if (0.1 <= fVar10) {
                      fVar8 = fVar10;
                    }
                  }
                }
              }
              else {
                fVar8 = 0.0;
              }
            }
          }
          fVar6 = fVar6 * fVar8;
          lVar5 = lVar5 + 1;
        } while (lVar5 < (valueRange.m_type)->m_numElements);
      }
    }
  }
  return fVar6;
}

Assistant:

static inline void computeValueRange (float outMin, float outMax, float& inMin, float& inMax)
	{
		DE_VERIFY(C::transformValueRange(outMin, outMax, inMin, inMax));
		DE_VERIFY(quantizeFloatRange(inMin, inMax));
		DE_ASSERT(inMin <= inMax);
	}